

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_alloc(parser *p)

{
  wchar_t wVar1;
  errr eVar2;
  int local_30;
  int local_2c;
  wchar_t amax;
  wchar_t amin;
  char *tmp;
  artifact *a;
  parser *p_local;
  
  a = (artifact *)p;
  tmp = (char *)parser_priv(p);
  _amax = parser_getstr((parser *)a,"minmax");
  if (tmp == (char *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint((parser *)a,"common");
    *(wchar_t *)(tmp + 0xf4) = wVar1;
    eVar2 = grab_int_range(&local_2c,&local_30,_amax,"to");
    if (eVar2 == 0) {
      if ((((local_2c < 0x100) && (local_30 < 0x100)) && (-1 < local_2c)) && (-1 < local_30)) {
        *(int *)(tmp + 0xf8) = local_2c;
        *(int *)(tmp + 0xfc) = local_30;
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
      else {
        p_local._4_4_ = PARSE_ERROR_OUT_OF_BOUNDS;
      }
    }
    else {
      p_local._4_4_ = PARSE_ERROR_INVALID_ALLOCATION;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_artifact_alloc(struct parser *p) {
	struct artifact *a = parser_priv(p);
	const char *tmp = parser_getstr(p, "minmax");
	int amin, amax;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	a->alloc_prob = parser_getint(p, "common");
	if (grab_int_range(&amin, &amax, tmp, "to")) {
		return PARSE_ERROR_INVALID_ALLOCATION;
	}
	if (amin > 255 || amax > 255 || amin < 0 || amax < 0) {
		return PARSE_ERROR_OUT_OF_BOUNDS;
	}
	a->alloc_min = amin;
	a->alloc_max = amax;
	return PARSE_ERROR_NONE;
}